

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

void leveldb::SaveValue(void *arg,Slice *ikey,Slice *v)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  Slice *in_RDX;
  int *in_RDI;
  ParsedInternalKey parsed_key;
  Saver *s;
  undefined1 local_40 [16];
  ParsedInternalKey *in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  
  ParsedInternalKey::ParsedInternalKey((ParsedInternalKey *)0x12dc67);
  bVar2 = ParseInternalKey((Slice *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                           in_stack_ffffffffffffffd0);
  if (bVar2) {
    iVar3 = (**(code **)(**(long **)(in_RDI + 2) + 0x10))
                      (*(long **)(in_RDI + 2),local_40,in_RDI + 4);
    if (iVar3 == 0) {
      iVar3 = 2;
      if (in_stack_ffffffffffffffd8 == 1) {
        iVar3 = 1;
      }
      *in_RDI = iVar3;
      if ((*in_RDI == 1) && (*(long *)(in_RDI + 8) != 0)) {
        pcVar1 = *(char **)(in_RDI + 8);
        pcVar4 = Slice::data(in_RDX);
        Slice::size(in_RDX);
        std::__cxx11::string::assign(pcVar1,(ulong)pcVar4);
      }
    }
  }
  else {
    *in_RDI = 3;
  }
  return;
}

Assistant:

static void SaveValue(void* arg, const Slice& ikey, const Slice& v) {
  Saver* s = reinterpret_cast<Saver*>(arg);
  ParsedInternalKey parsed_key;
  if (!ParseInternalKey(ikey, &parsed_key)) {
    s->state = kCorrupt;
  } else {
    if (s->ucmp->Compare(parsed_key.user_key, s->user_key) == 0) {
      s->state = (parsed_key.type == kTypeValue) ? kFound : kDeleted;
      if (s->state == kFound && s->value != nullptr) {
        s->value->assign(v.data(), v.size());
      }
    }
  }
}